

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void generateSortTail(Parse *pParse,Select *p,SortCtx *pSort,int nColumn,SelectDest *pDest)

{
  Vdbe *p_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  int in_ECX;
  char *pcVar4;
  ulong uVar5;
  undefined8 *in_RDX;
  long in_RSI;
  Parse *in_RDI;
  byte *in_R8;
  int r1;
  int i2;
  int iRead;
  int regSortOut;
  ExprList_item *aOutEx;
  int nRefKey;
  int bSeq;
  int i;
  int iSortTab;
  int nKey;
  int iCol;
  int regRowid;
  int regRow;
  int iParm;
  int eDest;
  ExprList *pOrderBy;
  int iTab;
  int addrOnce;
  int addr;
  int addrContinue;
  int addrBreak;
  Vdbe *v;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Parse *in_stack_ffffffffffffff68;
  int iVar6;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_74;
  int local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_40;
  int local_1c;
  
  p_00 = in_RDI->pVdbe;
  sqlite3VdbeMakeLabel(in_RDI);
  local_40 = 0;
  uVar1 = (uint)*in_R8;
  lVar3 = *(long *)(in_RSI + 0x20) + 8;
  uVar2 = *(int *)*in_RDX - *(int *)(in_RDX + 1);
  if ((*(int *)(in_RDX + 1) == 0) || (uVar2 == 1)) {
    pcVar4 = "";
    if (*(int *)(in_RDX + 1) != 0) {
      pcVar4 = "LAST TERM OF ";
    }
    sqlite3VdbeExplain(in_RDI,'\0',"USE TEMP B-TREE FOR %sORDER BY",pcVar4);
  }
  else {
    sqlite3VdbeExplain(in_RDI,'\0',"USE TEMP B-TREE FOR LAST %d TERMS OF ORDER BY",(ulong)uVar2);
  }
  if (*(int *)((long)in_RDX + 0x14) != 0) {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c);
    sqlite3VdbeResolveLabel
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  }
  local_1c = in_ECX;
  if (((uVar1 == 9) || (uVar1 == 0xd)) || (uVar1 == 10)) {
    if ((uVar1 == 10) && (*(int *)(in_RSI + 0xc) != 0)) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    }
    local_60 = 0;
    local_5c = *(int *)(in_R8 + 0xc);
  }
  else {
    local_60 = sqlite3GetTempReg(in_RDI);
    if ((uVar1 == 0xc) || (uVar1 == 0xe)) {
      local_5c = sqlite3GetTempReg(in_RDI);
      local_1c = 0;
    }
    else {
      local_5c = sqlite3GetTempRange(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    }
  }
  if ((*(byte *)((long)in_RDX + 0x24) & 1) == 0) {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    codeOffset((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    local_74 = 1;
    if (0 < *(int *)(in_RSI + 0xc)) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    }
  }
  else {
    in_stack_ffffffffffffff7c = in_RDI->nMem + 1;
    in_RDI->nMem = in_stack_ffffffffffffff7c;
    in_RDI->nTab = in_RDI->nTab + 1;
    if (*(int *)((long)in_RDX + 0x14) != 0) {
      local_40 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,
                                                    in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff5c);
    }
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                      (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68
                     );
    if (local_40 != 0) {
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c);
    }
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                      (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68
                     );
    local_74 = 0;
  }
  local_64 = uVar2 + local_74 + -1;
  for (local_70 = 0; iVar6 = local_1c, local_70 < local_1c; local_70 = local_70 + 1) {
    if (*(short *)(lVar3 + (long)local_70 * 0x18 + 0x14) == 0) {
      local_64 = local_64 + 1;
    }
  }
  while (local_70 = iVar6 + -1, -1 < local_70) {
    if (*(short *)(lVar3 + (long)local_70 * 0x18 + 0x14) == 0) {
      in_stack_ffffffffffffff78 = local_64;
      local_64 = local_64 + -1;
    }
    else {
      in_stack_ffffffffffffff78 = *(ushort *)(lVar3 + (long)local_70 * 0x18 + 0x14) - 1;
    }
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                      (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68
                     );
    iVar6 = local_70;
  }
  uVar2 = uVar1 - 10;
  uVar5 = (ulong)uVar2;
  switch(uVar5) {
  case 0:
    break;
  case 1:
    sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),0,uVar2,
                      in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                      (char *)CONCAT44(in_stack_ffffffffffffff5c,local_1c),(int)lVar3);
    sqlite3VdbeAddOp4Int
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)(uVar5 >> 0x20),(int)uVar5,
               in_stack_ffffffffffffff64);
    in_stack_ffffffffffffff58 = local_1c;
    break;
  case 2:
  case 4:
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,0,uVar2);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)(uVar5 >> 0x20),
                      (int)uVar5);
    sqlite3VdbeChangeP5(p_00,8);
    break;
  default:
    if (uVar1 == 9) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
    }
    else {
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    }
    break;
  case 5:
    in_stack_ffffffffffffff74 = *(int *)(in_R8 + 8);
    in_stack_ffffffffffffff70 = sqlite3GetTempReg(in_RDI);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,(int)(uVar5 >> 0x20),
                      (int)uVar5);
    iVar6 = (int)(uVar5 >> 0x20);
    if (in_stack_ffffffffffffff74 < 0) {
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,iVar6,(int)uVar5);
    }
    else {
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,iVar6,(int)uVar5,
                 in_stack_ffffffffffffff64);
    }
  }
  iVar6 = (int)(uVar5 >> 0x20);
  if (local_60 != 0) {
    if (uVar1 == 0xb) {
      sqlite3ReleaseTempRange
                ((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    }
    else {
      sqlite3ReleaseTempReg(in_RDI,local_5c);
    }
    sqlite3ReleaseTempReg(in_RDI,local_60);
  }
  sqlite3VdbeResolveLabel
            ((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar6);
  if ((*(byte *)((long)in_RDX + 0x24) & 1) == 0) {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
  }
  else {
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,0);
  }
  if (*(int *)(in_RDX + 2) != 0) {
    sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  }
  sqlite3VdbeResolveLabel
            ((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar6);
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  SortCtx *pSort,   /* Information on the ORDER BY clause */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  Vdbe *v = pParse->pVdbe;                     /* The prepared statement */
  int addrBreak = pSort->labelDone;            /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(pParse);/* Jump here for next cycle */
  int addr;                       /* Top of output loop. Jump for Next. */
  int addrOnce = 0;
  int iTab;
  ExprList *pOrderBy = pSort->pOrderBy;
  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;
  int regRow;
  int regRowid;
  int iCol;
  int nKey;                       /* Number of key columns in sorter record */
  int iSortTab;                   /* Sorter cursor to read from */
  int i;
  int bSeq;                       /* True if sorter record includes seq. no. */
  int nRefKey = 0;
  struct ExprList_item *aOutEx = p->pEList->a;
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExplain;                /* Address of OP_Explain instruction */
#endif

  nKey = pOrderBy->nExpr - pSort->nOBSat;
  if( pSort->nOBSat==0 || nKey==1 ){
    ExplainQueryPlan2(addrExplain, (pParse, 0,
      "USE TEMP B-TREE FOR %sORDER BY", pSort->nOBSat?"LAST TERM OF ":""
    ));
  }else{
    ExplainQueryPlan2(addrExplain, (pParse, 0,
      "USE TEMP B-TREE FOR LAST %d TERMS OF ORDER BY", nKey
    ));
  }
  sqlite3VdbeScanStatusRange(v, addrExplain,pSort->addrPush,pSort->addrPushEnd);
  sqlite3VdbeScanStatusCounters(v, addrExplain, addrExplain, pSort->addrPush);


  assert( addrBreak<0 );
  if( pSort->labelBkOut ){
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeGoto(v, addrBreak);
    sqlite3VdbeResolveLabel(v, pSort->labelBkOut);
  }

#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  /* Open any cursors needed for sorter-reference expressions */
  for(i=0; i<pSort->nDefer; i++){
    Table *pTab = pSort->aDefer[i].pTab;
    int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
    sqlite3OpenTable(pParse, pSort->aDefer[i].iCsr, iDb, pTab, OP_OpenRead);
    nRefKey = MAX(nRefKey, pSort->aDefer[i].nKey);
  }
#endif

  iTab = pSort->iECursor;
  if( eDest==SRT_Output || eDest==SRT_Coroutine || eDest==SRT_Mem ){
    if( eDest==SRT_Mem && p->iOffset ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pDest->iSdst);
    }
    regRowid = 0;
    regRow = pDest->iSdst;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
    if( eDest==SRT_EphemTab || eDest==SRT_Table ){
      regRow = sqlite3GetTempReg(pParse);
      nColumn = 0;
    }else{
      regRow = sqlite3GetTempRange(pParse, nColumn);
    }
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    int regSortOut = ++pParse->nMem;
    iSortTab = pParse->nTab++;
    if( pSort->labelBkOut ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    }
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, iSortTab, regSortOut,
        nKey+1+nColumn+nRefKey);
    if( addrOnce ) sqlite3VdbeJumpHere(v, addrOnce);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    VdbeCoverage(v);
    assert( p->iLimit==0 && p->iOffset==0 );
    sqlite3VdbeAddOp3(v, OP_SorterData, iTab, regSortOut, iSortTab);
    bSeq = 0;
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak); VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    iSortTab = iTab;
    bSeq = 1;
    if( p->iOffset>0 ){
      sqlite3VdbeAddOp2(v, OP_AddImm, p->iLimit, -1);
    }
  }
  for(i=0, iCol=nKey+bSeq-1; i<nColumn; i++){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].fg.bSorterRef ) continue;
#endif
    if( aOutEx[i].u.x.iOrderByCol==0 ) iCol++;
  }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  if( pSort->nDefer ){
    int iKey = iCol+1;
    int regKey = sqlite3GetTempRange(pParse, nRefKey);

    for(i=0; i<pSort->nDefer; i++){
      int iCsr = pSort->aDefer[i].iCsr;
      Table *pTab = pSort->aDefer[i].pTab;
      int nKey = pSort->aDefer[i].nKey;

      sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, iCsr,
            sqlite3VdbeCurrentAddr(v)+1, regKey);
      }else{
        int k;
        int iJmp;
        assert( sqlite3PrimaryKeyIndex(pTab)->nKeyCol==nKey );
        for(k=0; k<nKey; k++){
          sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey+k);
        }
        iJmp = sqlite3VdbeCurrentAddr(v);
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, iCsr, iJmp+2, regKey, nKey);
        sqlite3VdbeAddOp4Int(v, OP_IdxLE, iCsr, iJmp+3, regKey, nKey);
        sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      }
    }
    sqlite3ReleaseTempRange(pParse, regKey, nRefKey);
  }
#endif
  for(i=nColumn-1; i>=0; i--){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].fg.bSorterRef ){
      sqlite3ExprCode(pParse, aOutEx[i].pExpr, regRow+i);
    }else
#endif
    {
      int iRead;
      if( aOutEx[i].u.x.iOrderByCol ){
        iRead = aOutEx[i].u.x.iOrderByCol-1;
      }else{
        iRead = iCol--;
      }
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iRead, regRow+i);
      VdbeComment((v, "%s", aOutEx[i].zEName));
    }
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, addrExplain, -1);
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, nKey+bSeq, regRow);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==sqlite3Strlen30(pDest->zAffSdst) );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, nColumn, regRowid,
                        pDest->zAffSdst, nColumn);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, regRowid, regRow, nColumn);
      break;
    }
    case SRT_Mem: {
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    case SRT_Upfrom: {
      int i2 = pDest->iSDParm2;
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord,regRow+(i2<0),nColumn-(i2<0),r1);
      if( i2<0 ){
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, regRow);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regRow, i2);
      }
      break;
    }
    default: {
      assert( eDest==SRT_Output || eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  if( regRowid ){
    if( eDest==SRT_Set ){
      sqlite3ReleaseTempRange(pParse, regRow, nColumn);
    }else{
      sqlite3ReleaseTempReg(pParse, regRow);
    }
    sqlite3ReleaseTempReg(pParse, regRowid);
  }
  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr); VdbeCoverage(v);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr); VdbeCoverage(v);
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, sqlite3VdbeCurrentAddr(v)-1, -1);
  if( pSort->regReturn ) sqlite3VdbeAddOp1(v, OP_Return, pSort->regReturn);
  sqlite3VdbeResolveLabel(v, addrBreak);
}